

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_tec_int(REF_EDGE ref_edge,char *filename,REF_INT *data)

{
  int iVar1;
  REF_NODE pRVar2;
  FILE *__stream;
  FILE *file;
  REF_INT node;
  REF_INT edge;
  REF_NODE ref_node;
  REF_INT *data_local;
  char *filename_local;
  REF_EDGE ref_edge_local;
  
  pRVar2 = ref_edge->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x244,
           "ref_edge_tec_int","unable to open file");
    ref_edge_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine scalar file\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"s\"\n");
    fprintf(__stream,"zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uint)(ref_edge->n << 1),(ulong)(uint)ref_edge->n,"point","felineseg");
    for (file._4_4_ = 0; file._4_4_ < ref_edge->n; file._4_4_ = file._4_4_ + 1) {
      iVar1 = ref_edge->e2n[file._4_4_ << 1];
      fprintf(__stream," %.16e %.16e %.16e %d\n",pRVar2->real[iVar1 * 0xf],
              pRVar2->real[iVar1 * 0xf + 1],pRVar2->real[iVar1 * 0xf + 2],
              (ulong)(uint)data[file._4_4_]);
      iVar1 = ref_edge->e2n[file._4_4_ * 2 + 1];
      fprintf(__stream," %.16e %.16e %.16e %d\n",pRVar2->real[iVar1 * 0xf],
              pRVar2->real[iVar1 * 0xf + 1],pRVar2->real[iVar1 * 0xf + 2],
              (ulong)(uint)data[file._4_4_]);
    }
    for (file._4_4_ = 0; file._4_4_ < ref_edge->n; file._4_4_ = file._4_4_ + 1) {
      fprintf(__stream," %d %d\n",(ulong)(file._4_4_ * 2 + 1),(ulong)(file._4_4_ * 2 + 2));
    }
    fclose(__stream);
    ref_edge_local._4_4_ = 0;
  }
  return ref_edge_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_tec_int(REF_EDGE ref_edge, const char *filename,
                                    REF_INT *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT edge;
  REF_INT node;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine scalar file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"s\"\n");

  fprintf(
      file,
      "zone t=\"scalar\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      2 * ref_edge_n(ref_edge), ref_edge_n(ref_edge), "point", "felineseg");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = ref_edge_e2n(ref_edge, 0, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            data[edge]);
    node = ref_edge_e2n(ref_edge, 1, edge);
    fprintf(file, " %.16e %.16e %.16e %d\n", ref_node_xyz(ref_node, 0, node),
            ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node),
            data[edge]);
  }

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++)
    fprintf(file, " %d %d\n", 1 + 2 * edge, 2 + 2 * edge);

  fclose(file);

  return REF_SUCCESS;
}